

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

bool __thiscall r_comp::Preprocessor::isTemplateClass(Preprocessor *this,Ptr *replistruct)

{
  Type TVar1;
  bool bVar2;
  element_type *peVar3;
  reference psVar4;
  shared_ptr<r_comp::RepliStruct> local_a8;
  int local_98;
  string local_88 [8];
  string type;
  string local_68 [8];
  string name;
  undefined1 local_48 [8];
  Ptr childstruct;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  *__range1;
  Ptr *replistruct_local;
  Preprocessor *this_local;
  
  peVar3 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)replistruct);
  __end1 = std::
           vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
           ::begin(&peVar3->args);
  childstruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
         ::end(&peVar3->args);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
                                     *)&childstruct.
                                        super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount), bVar2) {
    psVar4 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr
              ((shared_ptr<r_comp::RepliStruct> *)local_48,psVar4);
    std::__cxx11::string::string(local_68);
    std::__cxx11::string::string(local_88);
    peVar3 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_48);
    TVar1 = peVar3->type;
    if (TVar1 - Structure < 2) {
LAB_001baf92:
      std::shared_ptr<r_comp::RepliStruct>::shared_ptr
                (&local_a8,(shared_ptr<r_comp::RepliStruct> *)local_48);
      bVar2 = isTemplateClass(this,&local_a8);
      std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_a8);
      if (!bVar2) goto LAB_001bb010;
      this_local._7_1_ = 1;
      local_98 = 1;
    }
    else {
      if (TVar1 == Atom) {
        peVar3 = std::
                 __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_48);
        bVar2 = std::operator==(&peVar3->cmd,":~");
        if (bVar2) {
          this_local._7_1_ = 1;
          local_98 = 1;
          goto LAB_001bb01a;
        }
      }
      else if (TVar1 == Development) goto LAB_001baf92;
LAB_001bb010:
      local_98 = 0;
    }
LAB_001bb01a:
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_68);
    if (local_98 == 0) {
      local_98 = 0;
    }
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr((shared_ptr<r_comp::RepliStruct> *)local_48);
    if (local_98 != 0) goto LAB_001bb08a;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
    ::operator++(&__end1);
  }
  this_local._7_1_ = 0;
LAB_001bb08a:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Preprocessor::isTemplateClass(RepliStruct::Ptr replistruct)
{
    for (RepliStruct::Ptr childstruct : replistruct->args) {
        std::string name;
        std::string type;

        switch (childstruct->type) {
        case RepliStruct::Atom:
            if (childstruct->cmd == ":~") {
                return true;
            }

            break;

        case RepliStruct::Structure: // template instantiation; args are the actual parameters.
        case RepliStruct::Development: // actual template arg as a list of args.
        case RepliStruct::Set: // sets can contain tpl args.
            if (isTemplateClass(childstruct)) {
                return true;
            }

            break;

        default:
            break;
        }
    }

    return false;
}